

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

void __thiscall chaiscript::exception::eval_error::eval_error(eval_error *this,string *t_why)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  runtime_error *in_RDI;
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_30 [32];
  
  std::operator+((char *)in_RDI,in_RSI);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::runtime_error::runtime_error(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  *(undefined ***)in_RDI = &PTR__eval_error_005be398;
  std::__cxx11::string::string((string *)(in_RDI + 0x10),(string *)in_RSI);
  File_Position::File_Position((File_Position *)(in_RDI + 0x30));
  std::__cxx11::string::string((string *)(in_RDI + 0x38));
  std::__cxx11::string::string((string *)(in_RDI + 0x58));
  std::
  vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
  ::vector((vector<std::shared_ptr<const_chaiscript::AST_Node>,_std::allocator<std::shared_ptr<const_chaiscript::AST_Node>_>_>
            *)0x1c564f);
  return;
}

Assistant:

eval_error(const std::string &t_why) CHAISCRIPT_NOEXCEPT
        : std::runtime_error("Error: \"" + t_why + "\" "),
        reason(t_why) 
      {}